

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

bool __thiscall
node::BlockManager::LoadBlockIndex(BlockManager *this,optional<uint256> *snapshot_blockhash)

{
  Notifications *pNVar1;
  long *plVar2;
  string_view source_file;
  string_view source_file_00;
  function<CBlockIndex_*(const_uint256_&)> insertBlockIndex;
  pointer ppCVar3;
  bool bVar4;
  bool bVar5;
  int i;
  int iVar6;
  optional<AssumeutxoData> *poVar7;
  CBlockIndex *pCVar8;
  Logger *pLVar9;
  ulong uVar10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  uint *puVar12;
  char *pcVar13;
  pointer ppCVar14;
  CBlockIndex *pCVar15;
  long in_FS_OFFSET;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  CBlockIndex *pindex;
  string log_msg;
  optional<AssumeutxoData> maybe_au_data;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> vSortedByHeight;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  CBlockIndex *local_1f8;
  int local_1cc;
  undefined1 local_1c8 [16];
  code *local_1b8;
  code *pcStack_1b0;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [32];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined1 local_f8 [16];
  undefined1 auStack_e8 [80];
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> local_98 [2];
  string local_58;
  _Alloc_hider local_38;
  
  local_38._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  local_1c8._8_8_ = 0;
  local_1c8._0_8_ = this;
  pcStack_1b0 = std::
                _Function_handler<CBlockIndex_*(const_uint256_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp:400:29)>
                ::_M_invoke;
  local_1b8 = std::
              _Function_handler<CBlockIndex_*(const_uint256_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp:400:29)>
              ::_M_manager;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->m_interrupt;
  insertBlockIndex.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffdf0;
  insertBlockIndex.super__Function_base._M_functor._M_unused._M_object =
       (void *)in_stack_fffffffffffffde8;
  insertBlockIndex.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffdf8;
  insertBlockIndex._M_invoker._0_4_ = in_stack_fffffffffffffe00;
  insertBlockIndex._M_invoker._4_4_ = in_stack_fffffffffffffe04;
  bVar4 = kernel::BlockTreeDB::LoadBlockIndexGuts
                    ((this->m_block_tree_db)._M_t.
                     super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>
                     .super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl,
                     &((this->m_opts).chainparams)->consensus,insertBlockIndex,
                     (SignalInterrupt *)local_1c8);
  if (local_1b8 != (code *)0x0) {
    (*local_1b8)(local_1c8,local_1c8,3);
  }
  if (bVar4) {
    if ((snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
        super__Optional_payload_base<uint256>._M_engaged == true) {
      CChainParams::AssumeutxoForBlockhash
                ((optional<AssumeutxoData> *)local_f8,(this->m_opts).chainparams,
                 (uint256 *)snapshot_blockhash);
      if (auStack_e8[0x40] == false) {
        pNVar1 = (this->m_opts).notifications;
        local_178._0_8_ = local_178 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_178,"Assumeutxo data not found for the given blockhash \'%s\'.",
                   "");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_158,
                     "Assumeutxo data not found for the given blockhash \'%s\'.","");
        }
        else {
          local_58._M_dataplus._M_p = "Assumeutxo data not found for the given blockhash \'%s\'.";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    (&local_158,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_58);
        }
        base_blob<256u>::ToString_abi_cxx11_(&local_58,snapshot_blockhash);
        tinyformat::format<std::__cxx11::string>
                  ((bilingual_str *)local_138,(tinyformat *)local_178,(bilingual_str *)&local_58,
                   args);
        (*pNVar1->_vptr_Notifications[8])(pNVar1,local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_p != &local_108) {
          operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
        }
        if ((CBlockIndex *)local_138._0_8_ != (CBlockIndex *)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
        }
        if (local_58._M_dataplus._M_p != (pointer)((long)&local_58 + 0x10)) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        pCVar8 = (CBlockIndex *)local_178._0_8_;
        if ((CBlockIndex *)local_178._0_8_ != (CBlockIndex *)(local_178 + 0x10)) goto LAB_0092f148;
      }
      else {
        pcVar13 = "maybe_au_data";
        poVar7 = inline_assertion_check<true,std::optional<AssumeutxoData>const&>
                           ((optional<AssumeutxoData> *)local_f8,
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
                            ,0x19a,"LoadBlockIndex","maybe_au_data");
        (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int> =
             (_Optional_payload_base<int>)
             ((ulong)(uint)(poVar7->super__Optional_base<AssumeutxoData,_true,_true>)._M_payload.
                           super__Optional_payload_base<AssumeutxoData>._M_payload._M_value.height |
             0x100000000);
        pCVar8 = LookupBlockIndex(this,(uint256 *)snapshot_blockhash);
        pCVar8->m_chain_tx_count =
             (poVar7->super__Optional_base<AssumeutxoData,_true,_true>)._M_payload.
             super__Optional_payload_base<AssumeutxoData>._M_payload._M_value.m_chain_tx_count;
        base_blob<256u>::ToString_abi_cxx11_((string *)local_198,snapshot_blockhash);
        pLVar9 = LogInstance();
        bVar4 = BCLog::Logger::Enabled(pLVar9);
        if (bVar4) {
          local_138._8_8_ = (CBlockIndex *)0x0;
          local_138._16_8_ = local_138._16_8_ & 0xffffffffffffff00;
          local_138._0_8_ = (CBlockIndex *)(local_138 + 0x10);
          tinyformat::format<unsigned_long,std::__cxx11::string>
                    ((string *)local_178,(tinyformat *)"[snapshot] set m_chain_tx_count=%d for %s\n"
                     ,(char *)&(poVar7->super__Optional_base<AssumeutxoData,_true,_true>)._M_payload
                               .super__Optional_payload_base<AssumeutxoData>._M_payload._M_value.
                               m_chain_tx_count,(unsigned_long *)local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar13);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178)
          ;
          if ((CBlockIndex *)local_178._0_8_ != (CBlockIndex *)(local_178 + 0x10)) {
            operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
          }
          pLVar9 = LogInstance();
          local_178._0_8_ = (CBlockIndex *)0x5e;
          local_178._8_8_ =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
          ;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
          ;
          source_file_00._M_len = 0x5e;
          str_00._M_str = (char *)local_138._0_8_;
          str_00._M_len = local_138._8_8_;
          logging_function_00._M_str = "LoadBlockIndex";
          logging_function_00._M_len = 0xe;
          BCLog::Logger::LogPrintStr
                    (pLVar9,str_00,logging_function_00,source_file_00,0x1a2,ALL,Info);
          if ((CBlockIndex *)local_138._0_8_ != (CBlockIndex *)(local_138 + 0x10)) {
            operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
          }
        }
        local_178._16_8_ = local_198._16_8_;
        pCVar8 = (CBlockIndex *)local_198._0_8_;
        if ((CBlockIndex *)local_198._0_8_ != (CBlockIndex *)(local_198 + 0x10)) {
LAB_0092f148:
          operator_delete(pCVar8,local_178._16_8_ + 1);
        }
      }
      if (auStack_e8[0x40] == false) goto LAB_0092f7f7;
    }
    else if ((this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
             super__Optional_payload_base<int>._M_engaged == true) {
      (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = false;
    }
    local_f8[0] = (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int>._M_engaged ==
                  (snapshot_blockhash->super__Optional_base<uint256,_true,_true>)._M_payload.
                  super__Optional_payload_base<uint256>._M_engaged;
    pcVar13 = "m_snapshot_height.has_value() == snapshot_blockhash.has_value()";
    inline_assertion_check<true,bool>
              ((bool *)local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
               ,0x1aa,"LoadBlockIndex",
               "m_snapshot_height.has_value() == snapshot_blockhash.has_value()");
    GetAllBlockIndices(local_98,this);
    ppCVar3 = local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppCVar14 = local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar10 = (long)local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      lVar11 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<CBlockIndex**,std::vector<CBlockIndex*,std::allocator<CBlockIndex*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<node::CBlockIndexHeightOnlyComparator>>
                (local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<CBlockIndex**,std::vector<CBlockIndex*,std::allocator<CBlockIndex*>>>,__gnu_cxx::__ops::_Iter_comp_iter<node::CBlockIndexHeightOnlyComparator>>
                (ppCVar14,ppCVar3);
    }
    bVar4 = local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (!bVar4) {
      ppCVar14 = local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pCVar8 = (CBlockIndex *)0x0;
      do {
        local_198._0_8_ = *ppCVar14;
        bVar5 = util::SignalInterrupt::operator_cast_to_bool(this->m_interrupt);
        pCVar15 = (CBlockIndex *)local_198._0_8_;
        if (bVar5) {
LAB_0092f26a:
          bVar5 = false;
          pCVar15 = pCVar8;
        }
        else {
          if ((pCVar8 != (CBlockIndex *)0x0) &&
             (iVar6 = pCVar8->nHeight + 1, iVar6 < *(int *)(local_198._0_8_ + 0x18))) {
            local_1cc = iVar6;
            pLVar9 = LogInstance();
            bVar5 = BCLog::Logger::Enabled(pLVar9);
            if (bVar5) {
              local_f8._0_8_ = auStack_e8;
              local_f8._8_8_ = (CBlockIndex *)0x0;
              auStack_e8._0_8_ = auStack_e8._0_8_ & 0xffffffffffffff00;
              tinyformat::format<char[15],int>
                        ((string *)local_138,
                         (tinyformat *)
                         "%s: block index is non-contiguous, index of height %d missing\n",
                         "LoadBlockIndex",(char (*) [15])&local_1cc,(int *)pcVar13);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_f8,(string *)local_138);
              if ((CBlockIndex *)local_138._0_8_ != (CBlockIndex *)(local_138 + 0x10)) {
                operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
              }
              pLVar9 = LogInstance();
              local_138._0_8_ = (CBlockIndex *)0x5e;
              local_138._8_8_ =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
              ;
              source_file._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
              ;
              source_file._M_len = 0x5e;
              str._M_str = (char *)local_f8._0_8_;
              str._M_len = local_f8._8_8_;
              logging_function._M_str = "LoadBlockIndex";
              logging_function._M_len = 0xe;
              pcVar13 = "LoadBlockIndex";
              BCLog::Logger::LogPrintStr(pLVar9,str,logging_function,source_file,0x1b5,ALL,Error);
              if ((CBlockIndex *)local_f8._0_8_ != (CBlockIndex *)auStack_e8) {
                operator_delete((void *)local_f8._0_8_,auStack_e8._0_8_ + 1);
              }
            }
            goto LAB_0092f26a;
          }
          pCVar8 = *(CBlockIndex **)(local_198._0_8_ + 8);
          if (pCVar8 == (CBlockIndex *)0x0) {
            local_58._M_dataplus._M_p = (pointer)0x0;
            local_58._M_string_length = 0;
            local_58.field_2._M_allocated_capacity = 0;
            local_1f8 = (CBlockIndex *)0x0;
          }
          else {
            local_1f8 = *(CBlockIndex **)(pCVar8->nChainWork).super_base_uint<256U>.pn;
            local_58.field_2._M_allocated_capacity =
                 *(undefined8 *)((pCVar8->nChainWork).super_base_uint<256U>.pn + 6);
            local_58._0_16_ =
                 *(undefined1 (*) [16])((pCVar8->nChainWork).super_base_uint<256U>.pn + 2);
          }
          GetBlockProof((arith_uint256 *)local_178,(CBlockIndex *)local_198._0_8_);
          local_f8._0_8_ = local_1f8;
          auStack_e8._8_8_ = local_58.field_2._M_allocated_capacity;
          local_f8._8_8_ = local_58._M_dataplus._M_p;
          auStack_e8._0_8_ = local_58._M_string_length;
          lVar11 = 0;
          uVar10 = 0;
          do {
            uVar10 = (ulong)*(uint *)(local_178 + lVar11 * 4) +
                     *(uint *)(local_f8 + lVar11 * 4) + uVar10;
            *(int *)(local_f8 + lVar11 * 4) = (int)uVar10;
            uVar10 = uVar10 >> 0x20;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 8);
          local_138._16_8_ = auStack_e8._0_8_;
          local_138._24_8_ = auStack_e8._8_8_;
          local_138._0_8_ = local_f8._0_8_;
          local_138._8_8_ = local_f8._8_8_;
          *(undefined8 *)(local_198._0_8_ + 0x38) = auStack_e8._0_8_;
          *(undefined8 *)(local_198._0_8_ + 0x40) = auStack_e8._8_8_;
          *(undefined8 *)(((arith_uint256 *)(local_198._0_8_ + 0x28))->super_base_uint<256U>).pn =
               local_f8._0_8_;
          *(undefined8 *)(local_198._0_8_ + 0x30) = local_f8._8_8_;
          pCVar8 = *(CBlockIndex **)(local_198._0_8_ + 8);
          if (pCVar8 == (CBlockIndex *)0x0) {
            puVar12 = (uint *)(local_198._0_8_ + 0x80);
          }
          else {
            puVar12 = &pCVar8->nTimeMax;
            if (pCVar8->nTimeMax < *(uint32_t *)(local_198._0_8_ + 0x80)) {
              puVar12 = (uint *)(local_198._0_8_ + 0x80);
            }
          }
          *(uint *)(local_198._0_8_ + 0x90) = *puVar12;
          uVar10 = (ulong)*(uint *)(local_198._0_8_ + 0x48);
          if (uVar10 != 0) {
            if (pCVar8 == (CBlockIndex *)0x0) {
              *(ulong *)(local_198._0_8_ + 0x50) = uVar10;
            }
            else {
              if (((this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int>._M_engaged == true) &&
                 (*(int *)(local_198._0_8_ + 0x18) ==
                  (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int>._M_payload._M_value)) {
                plVar2 = *(long **)local_198._0_8_;
                if (plVar2 == (long *)0x0) {
                  __assert_fail("phashBlock != nullptr",
                                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                                ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
                }
                local_f8._0_8_ = *plVar2;
                local_f8._8_8_ = plVar2[1];
                auStack_e8._0_8_ = plVar2[2];
                auStack_e8._8_8_ = plVar2[3];
                auVar17[0] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[0x10] == (uchar)plVar2[2]);
                auVar17[1] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[0x11] ==
                              *(uchar *)((long)plVar2 + 0x11));
                auVar17[2] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[0x12] ==
                              *(uchar *)((long)plVar2 + 0x12));
                auVar17[3] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[0x13] ==
                              *(uchar *)((long)plVar2 + 0x13));
                auVar17[4] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[0x14] ==
                              *(uchar *)((long)plVar2 + 0x14));
                auVar17[5] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[0x15] ==
                              *(uchar *)((long)plVar2 + 0x15));
                auVar17[6] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[0x16] ==
                              *(uchar *)((long)plVar2 + 0x16));
                auVar17[7] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[0x17] ==
                              *(uchar *)((long)plVar2 + 0x17));
                auVar17[8] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[0x18] == (uchar)plVar2[3]);
                auVar17[9] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[0x19] ==
                              *(uchar *)((long)plVar2 + 0x19));
                auVar17[10] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value
                                .super_base_blob<256U>.m_data._M_elems[0x1a] ==
                               *(uchar *)((long)plVar2 + 0x1a));
                auVar17[0xb] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                                *(uchar *)((long)plVar2 + 0x1b));
                auVar17[0xc] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                                *(uchar *)((long)plVar2 + 0x1c));
                auVar17[0xd] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                                *(uchar *)((long)plVar2 + 0x1d));
                auVar17[0xe] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                                *(uchar *)((long)plVar2 + 0x1e));
                auVar17[0xf] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                                *(uchar *)((long)plVar2 + 0x1f));
                auVar16[0] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[0] == (char)*plVar2);
                auVar16[1] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[1] ==
                              *(uchar *)((long)plVar2 + 1));
                auVar16[2] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[2] ==
                              *(uchar *)((long)plVar2 + 2));
                auVar16[3] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[3] ==
                              *(uchar *)((long)plVar2 + 3));
                auVar16[4] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[4] ==
                              *(uchar *)((long)plVar2 + 4));
                auVar16[5] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[5] ==
                              *(uchar *)((long)plVar2 + 5));
                auVar16[6] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[6] ==
                              *(uchar *)((long)plVar2 + 6));
                auVar16[7] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[7] ==
                              *(uchar *)((long)plVar2 + 7));
                auVar16[8] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[8] == *(uchar *)(plVar2 + 1));
                auVar16[9] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                               _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value.
                               super_base_blob<256U>.m_data._M_elems[9] ==
                              *(uchar *)((long)plVar2 + 9));
                auVar16[10] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                _M_payload.super__Optional_payload_base<uint256>._M_payload._M_value
                                .super_base_blob<256U>.m_data._M_elems[10] ==
                               *(uchar *)((long)plVar2 + 10));
                auVar16[0xb] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0xb] ==
                                *(uchar *)((long)plVar2 + 0xb));
                auVar16[0xc] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0xc] ==
                                *(uchar *)((long)plVar2 + 0xc));
                auVar16[0xd] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0xd] ==
                                *(uchar *)((long)plVar2 + 0xd));
                auVar16[0xe] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0xe] ==
                                *(uchar *)((long)plVar2 + 0xe));
                auVar16[0xf] = -((snapshot_blockhash->super__Optional_base<uint256,_true,_true>).
                                 _M_payload.super__Optional_payload_base<uint256>._M_payload.
                                 _M_value.super_base_blob<256U>.m_data._M_elems[0xf] ==
                                *(uchar *)((long)plVar2 + 0xf));
                auVar16 = auVar16 & auVar17;
                if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff) {
                  local_f8._1_7_ = (undefined7)((ulong)local_f8._0_8_ >> 8);
                  local_f8[0] = *(uint64_t *)(local_198._0_8_ + 0x50) != 0;
                  pcVar13 = "pindex->m_chain_tx_count > 0";
                  inline_assertion_check<true,bool>
                            ((bool *)local_f8,
                             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
                             ,0x1c5,"LoadBlockIndex","pindex->m_chain_tx_count > 0");
                  goto LAB_0092f490;
                }
              }
              if (pCVar8->m_chain_tx_count == 0) {
                *(uint64_t *)(local_198._0_8_ + 0x50) = 0;
                local_f8._0_8_ = *(CBlockIndex **)(local_198._0_8_ + 8);
                local_f8._8_8_ = local_198._0_8_;
                std::
                _Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
                ::_M_emplace_equal<std::pair<CBlockIndex*,CBlockIndex*>>
                          ((_Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
                            *)&this->m_blocks_unlinked,
                           (pair<CBlockIndex_*,_CBlockIndex_*> *)local_f8);
              }
              else {
                *(uint64_t *)(local_198._0_8_ + 0x50) = pCVar8->m_chain_tx_count + uVar10;
              }
            }
          }
LAB_0092f490:
          if ((((*(uint32_t *)(local_198._0_8_ + 0x58) & 0x60) == 0) &&
              (*(CBlockIndex **)(local_198._0_8_ + 8) != (CBlockIndex *)0x0)) &&
             (((*(CBlockIndex **)(local_198._0_8_ + 8))->nStatus & 0x60) != 0)) {
            *(uint32_t *)(local_198._0_8_ + 0x58) = *(uint32_t *)(local_198._0_8_ + 0x58) | 0x40;
            std::
            _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
            ::_M_insert_unique<CBlockIndex*const&>
                      ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                        *)&this->m_dirty_blockindex,(CBlockIndex **)local_198);
          }
          bVar5 = true;
          if (*(CBlockIndex **)(local_198._0_8_ + 8) != (CBlockIndex *)0x0) {
            CBlockIndex::BuildSkip((CBlockIndex *)local_198._0_8_);
          }
        }
        if (!bVar5) break;
        ppCVar14 = ppCVar14 + 1;
        bVar4 = ppCVar14 ==
                local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
        pCVar8 = pCVar15;
      } while (!bVar4);
    }
    if (local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98[0].super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_98[0].
                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98[0].
                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
LAB_0092f7f7:
    bVar4 = false;
  }
  if (*(pointer *)(in_FS_OFFSET + 0x28) != local_38._M_p) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool BlockManager::LoadBlockIndex(const std::optional<uint256>& snapshot_blockhash)
{
    if (!m_block_tree_db->LoadBlockIndexGuts(
            GetConsensus(), [this](const uint256& hash) EXCLUSIVE_LOCKS_REQUIRED(cs_main) { return this->InsertBlockIndex(hash); }, m_interrupt)) {
        return false;
    }

    if (snapshot_blockhash) {
        const std::optional<AssumeutxoData> maybe_au_data = GetParams().AssumeutxoForBlockhash(*snapshot_blockhash);
        if (!maybe_au_data) {
            m_opts.notifications.fatalError(strprintf(_("Assumeutxo data not found for the given blockhash '%s'."), snapshot_blockhash->ToString()));
            return false;
        }
        const AssumeutxoData& au_data = *Assert(maybe_au_data);
        m_snapshot_height = au_data.height;
        CBlockIndex* base{LookupBlockIndex(*snapshot_blockhash)};

        // Since m_chain_tx_count (responsible for estimated progress) isn't persisted
        // to disk, we must bootstrap the value for assumedvalid chainstates
        // from the hardcoded assumeutxo chainparams.
        base->m_chain_tx_count = au_data.m_chain_tx_count;
        LogPrintf("[snapshot] set m_chain_tx_count=%d for %s\n", au_data.m_chain_tx_count, snapshot_blockhash->ToString());
    } else {
        // If this isn't called with a snapshot blockhash, make sure the cached snapshot height
        // is null. This is relevant during snapshot completion, when the blockman may be loaded
        // with a height that then needs to be cleared after the snapshot is fully validated.
        m_snapshot_height.reset();
    }

    Assert(m_snapshot_height.has_value() == snapshot_blockhash.has_value());

    // Calculate nChainWork
    std::vector<CBlockIndex*> vSortedByHeight{GetAllBlockIndices()};
    std::sort(vSortedByHeight.begin(), vSortedByHeight.end(),
              CBlockIndexHeightOnlyComparator());

    CBlockIndex* previous_index{nullptr};
    for (CBlockIndex* pindex : vSortedByHeight) {
        if (m_interrupt) return false;
        if (previous_index && pindex->nHeight > previous_index->nHeight + 1) {
            LogError("%s: block index is non-contiguous, index of height %d missing\n", __func__, previous_index->nHeight + 1);
            return false;
        }
        previous_index = pindex;
        pindex->nChainWork = (pindex->pprev ? pindex->pprev->nChainWork : 0) + GetBlockProof(*pindex);
        pindex->nTimeMax = (pindex->pprev ? std::max(pindex->pprev->nTimeMax, pindex->nTime) : pindex->nTime);

        // We can link the chain of blocks for which we've received transactions at some point, or
        // blocks that are assumed-valid on the basis of snapshot load (see
        // PopulateAndValidateSnapshot()).
        // Pruned nodes may have deleted the block.
        if (pindex->nTx > 0) {
            if (pindex->pprev) {
                if (m_snapshot_height && pindex->nHeight == *m_snapshot_height &&
                        pindex->GetBlockHash() == *snapshot_blockhash) {
                    // Should have been set above; don't disturb it with code below.
                    Assert(pindex->m_chain_tx_count > 0);
                } else if (pindex->pprev->m_chain_tx_count > 0) {
                    pindex->m_chain_tx_count = pindex->pprev->m_chain_tx_count + pindex->nTx;
                } else {
                    pindex->m_chain_tx_count = 0;
                    m_blocks_unlinked.insert(std::make_pair(pindex->pprev, pindex));
                }
            } else {
                pindex->m_chain_tx_count = pindex->nTx;
            }
        }
        if (!(pindex->nStatus & BLOCK_FAILED_MASK) && pindex->pprev && (pindex->pprev->nStatus & BLOCK_FAILED_MASK)) {
            pindex->nStatus |= BLOCK_FAILED_CHILD;
            m_dirty_blockindex.insert(pindex);
        }
        if (pindex->pprev) {
            pindex->BuildSkip();
        }
    }

    return true;
}